

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromLast
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong extraout_RDX;
  tCharPtr __s;
  int iVar7;
  VerySimpleReadOnlyString VVar8;
  
  uVar3 = reverseFind(find,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind),
                      0xffffffff);
  uVar1 = find->length;
  uVar6 = (ulong)uVar1;
  __s = find->data;
  uVar4 = uVar1 - uVar3;
  if (uVar4 == 0) {
    uVar4 = uVar3;
    if (in_CL != '\0') goto LAB_0010e79d;
    this->data = "";
  }
  else {
    iVar2 = ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind))->length;
    iVar7 = 0;
    if (in_CL == '\0') {
      iVar7 = iVar2;
    }
    __s = __s + (iVar7 + uVar3);
    if (in_CL == '\0') {
      uVar4 = uVar1 - (uVar3 + iVar2);
      uVar6 = (ulong)uVar4;
    }
LAB_0010e79d:
    this->data = __s;
    if (uVar4 != 0xffffffff) goto LAB_0010e7b3;
    if (__s != (char *)0x0) {
      sVar5 = strlen(__s);
      uVar4 = (uint)sVar5;
      uVar6 = extraout_RDX;
      goto LAB_0010e7b3;
    }
  }
  uVar4 = 0;
LAB_0010e7b3:
  this->length = uVar4;
  VVar8._8_8_ = uVar6;
  VVar8.data = (tCharPtr)this;
  return VVar8;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromLast(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = reverseFind(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? (includeFind ? data : "") : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (includeFind ? (unsigned int)length : 0) : (includeFind ? (unsigned int)length - pos : (unsigned int)length - pos - (unsigned int)find.length));
	}